

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefileCall::cmMakefileCall
          (cmMakefileCall *this,cmMakefile *mf,cmCommandContext *lfc,cmExecutionStatus *status)

{
  cmExecutionStatus *local_38;
  cmCommandContext *local_30;
  cmExecutionStatus *local_28;
  cmExecutionStatus *status_local;
  cmCommandContext *lfc_local;
  cmMakefile *mf_local;
  cmMakefileCall *this_local;
  
  this->Makefile = mf;
  local_30 = lfc;
  local_28 = status;
  status_local = (cmExecutionStatus *)lfc;
  lfc_local = (cmCommandContext *)mf;
  mf_local = (cmMakefile *)this;
  std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::push_back
            (&this->Makefile->ContextStack,&local_30);
  local_38 = local_28;
  std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::push_back
            (&this->Makefile->ExecutionStatusStack,&local_38);
  return;
}

Assistant:

cmMakefileCall::cmMakefileCall(cmMakefile* mf, const cmCommandContext& lfc,
                               cmExecutionStatus& status): Makefile(mf)
{
  this->Makefile->ContextStack.push_back(&lfc);
  this->Makefile->ExecutionStatusStack.push_back(&status);
}